

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseErase(Parser *this)

{
  bool bVar1;
  uint32_t count;
  RuntimeID RVar2;
  undefined1 local_a8 [4];
  uint32_t subscripts_1;
  String varName;
  uint32_t subscripts;
  undefined1 local_70 [8];
  PropertyName propName;
  Parser *this_local;
  
  propName.m_partCount = (size_t)this;
  bVar1 = CheckProperty(this,(size_t *)0x0);
  if (bVar1) {
    ParsePropertyName((PropertyName *)local_70,this);
    bVar1 = PropertyName::IsReadOnly((PropertyName *)local_70);
    if (bVar1) {
      Error<>(this,"Can\'t erase a readonly property");
    }
    else {
      varName.field_2._12_4_ = ParseSubscriptSet(this);
      Expect(this,NewLine,(char *)0x0);
      if (varName.field_2._12_4_ == 0) {
        Error<>(this,"Expected index operator after erase keyword");
      }
      else {
        EmitOpcode(this,ErasePropKeyVal);
        EmitCount(this,varName.field_2._12_4_);
        RVar2 = PropertyName::GetId((PropertyName *)local_70);
        EmitId(this,RVar2);
      }
    }
    PropertyName::~PropertyName((PropertyName *)local_70);
  }
  else {
    bVar1 = CheckVariable(this);
    if (bVar1) {
      ParseVariable_abi_cxx11_((String *)local_a8,this);
      count = ParseSubscriptSet(this);
      Expect(this,NewLine,(char *)0x0);
      if (count == 0) {
        EmitOpcode(this,EraseItr);
        RVar2 = VariableNameToRuntimeID(this,(String *)local_a8);
        EmitId(this,RVar2);
      }
      else {
        EmitOpcode(this,EraseVarKeyVal);
        EmitCount(this,count);
        RVar2 = VariableNameToRuntimeID(this,(String *)local_a8);
        EmitId(this,RVar2);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_a8);
    }
    else {
      Error<>(this,"Valid property or variable name expected after erase keyword");
    }
  }
  return;
}

Assistant:

inline_t void Parser::ParseErase()
	{
		if (CheckProperty())
		{
			auto propName = ParsePropertyName();
			if (propName.IsReadOnly())
			{
				Error("Can't erase a readonly property");
				return;
			}
			uint32_t subscripts = ParseSubscriptSet();
			Expect(SymbolType::NewLine);
			if (subscripts)
			{
				EmitOpcode(Opcode::ErasePropKeyVal);
				EmitCount(subscripts);
				EmitId(propName.GetId());
			}
			else
			{
				Error("Expected index operator after erase keyword");
				return;
			}
		}
		else if (CheckVariable())
		{
			auto varName = ParseVariable();
			uint32_t subscripts = ParseSubscriptSet();
			Expect(SymbolType::NewLine);
			if (subscripts)
			{
				EmitOpcode(Opcode::EraseVarKeyVal);
				EmitCount(subscripts);
				EmitId(VariableNameToRuntimeID(varName));
			}
			else
			{
				EmitOpcode(Opcode::EraseItr);
				EmitId(VariableNameToRuntimeID(varName));
			}
		}
		else
		{
			Error("Valid property or variable name expected after erase keyword");
			return;
		}
	}